

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracy_concurrentqueue.h
# Opt level: O2

Block * __thiscall
tracy::moodycamel::
ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::
requisition_block(ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>
                  *this)

{
  Block *pBVar1;
  
  pBVar1 = try_get_block_from_initial_pool(this);
  if (pBVar1 == (Block *)0x0) {
    pBVar1 = FreeList<tracy::moodycamel::ConcurrentQueue<tracy::QueueItem,_tracy::moodycamel::ConcurrentQueueDefaultTraits>::Block>
             ::try_get(&this->freeList);
    if (pBVar1 == (Block *)0x0) {
      pBVar1 = ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::
               create<tracy::moodycamel::ConcurrentQueue<tracy::QueueItem,tracy::moodycamel::ConcurrentQueueDefaultTraits>::Block>
                         ();
      return pBVar1;
    }
  }
  return pBVar1;
}

Assistant:

Block* requisition_block()
	{
		auto block = try_get_block_from_initial_pool();
		if (block != nullptr) {
			return block;
		}

		block = try_get_block_from_free_list();
		if (block != nullptr) {
			return block;
		}

		return create<Block>();
	}